

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

TryEmplaceResult * __thiscall
QHash<int,QByteArray>::insertOrAssign_impl<int_const&,QByteArray_const&>
          (TryEmplaceResult *__return_storage_ptr__,QHash<int,QByteArray> *this,int *key,
          QByteArray *value)

{
  Node<int,_QByteArray> *pNVar1;
  
  *(undefined1 **)&__return_storage_ptr__->inserted = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->iterator).i.d =
       (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->iterator).i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  tryEmplace_impl<int_const&,QByteArray_const&>(__return_storage_ptr__,this,key,value);
  if (__return_storage_ptr__->inserted == false) {
    pNVar1 = QHashPrivate::iterator<QHashPrivate::Node<int,_QByteArray>_>::node
                       ((iterator<QHashPrivate::Node<int,_QByteArray>_> *)__return_storage_ptr__);
    QByteArray::operator=(&pNVar1->value,value);
  }
  return __return_storage_ptr__;
}

Assistant:

TryEmplaceResult insertOrAssign_impl(K &&key, Value &&value)
    {
        auto r = tryEmplace(std::forward<K>(key), std::forward<Value>(value));
        if (!r.inserted)
            *r.iterator = std::forward<Value>(value); // `value` is untouched if we get here
        return r;
    }